

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instantiation.cpp
# Opt level: O2

void __thiscall
Inferences::Instantiation::tryMakeLiteralFalse
          (Instantiation *this,Literal *lit,Stack<Kernel::Substitution> *subs)

{
  bool bVar1;
  Interpretation IVar2;
  ulong uVar3;
  Term *pTVar4;
  socklen_t __len;
  undefined8 uVar5;
  Instantiation *this_00;
  Term *term;
  int __fd;
  Term *pTVar6;
  Substitution s2;
  Substitution s1;
  VariableIterator vit;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_110;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_e8;
  undefined1 local_c0 [112];
  long local_50;
  undefined1 local_40;
  
  bVar1 = Kernel::Theory::isInterpretedPredicate
                    ((Theory *)Kernel::theory,(lit->super_Term)._functor);
  if (((bVar1) &&
      (IVar2 = Kernel::Theory::interpretPredicate((Theory *)Kernel::theory,lit),
      IVar2 < REAL_LESS_EQUAL)) &&
     (uVar5 = 0x204041, (0x204041U >> (IVar2 & INT_REMAINDER_E) & 1) != 0)) {
    uVar3 = (ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff);
    pTVar4 = (Term *)(lit->super_Term)._args[uVar3 - 1]._content;
    pTVar6 = (Term *)(lit->super_Term)._args[uVar3]._content;
    if (((ulong)pTVar6 & 1) == 0) {
      term = pTVar6;
      pTVar6 = pTVar4;
      if (((ulong)pTVar4 & 1) == 0) {
        return;
      }
    }
    else {
      term = pTVar4;
      if (((ulong)pTVar4 & 1) != 0) {
        return;
      }
    }
    if (term != (Term *)0x0) {
      Kernel::VariableIterator::VariableIterator((VariableIterator *)(local_c0 + 0x50),term);
      do {
        bVar1 = Kernel::VariableIterator::hasNext((VariableIterator *)(local_c0 + 0x50));
        __len = (socklen_t)uVar5;
        __fd = (int)((ulong)pTVar6 >> 2);
        if (!bVar1) {
          local_c0._40_4_ = 1;
          local_c0._44_8_ = 0;
          local_c0._52_8_ = 0;
          local_c0._60_4_ = 0;
          local_c0._64_4_ = 0;
          local_c0._68_4_ = 0;
          local_c0._72_4_ = 0;
          local_c0._76_4_ = 0;
          Kernel::Substitution::bind((Substitution *)(local_c0 + 0x28),__fd,(sockaddr *)term,__len);
          Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
                    ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     local_c0,(DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                               *)(local_c0 + 0x28));
          Lib::Stack<Kernel::Substitution>::push(subs,(Substitution *)local_c0);
          this_00 = (Instantiation *)local_c0;
          Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                    ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     this_00);
          if ((((lit->super_Term)._args[0]._content & 4) != 0) &&
             (pTVar4 = tryGetDifferentValue(this_00,term), pTVar4 != (Term *)0x0)) {
            local_e8._timestamp = 1;
            local_e8._size = 0;
            local_e8._deleted = 0;
            local_e8._capacityIndex = 0;
            local_e8._capacity = 0;
            local_e8._20_8_ = 0;
            local_e8._28_8_ = 0;
            local_e8._afterLast._4_4_ = 0;
            Kernel::Substitution::bind((Substitution *)&local_e8,__fd,(sockaddr *)pTVar4,__len);
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
                      (&local_110,&local_e8);
            Lib::Stack<Kernel::Substitution>::push(subs,(Substitution *)&local_110);
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                      (&local_110);
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                      (&local_e8);
          }
          Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                    ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     (local_c0 + 0x28));
          break;
        }
        local_40 = 1;
      } while ((int)(**(ulong **)(local_50 + -8) >> 2) != __fd);
      Kernel::VariableIterator::~VariableIterator((VariableIterator *)(local_c0 + 0x50));
    }
  }
  return;
}

Assistant:

void Instantiation::tryMakeLiteralFalse(Literal* lit, Stack<Substitution>& subs)
{
  if(theory->isInterpretedPredicate(lit->functor())){
    Interpretation itp = theory->interpretPredicate(lit);
    //unsigned sort = theory->getOperationSort(interpretation);

    //TODO, very limited consideration, expand
    if (itp == Theory::EQUAL || itp == Theory::INT_LESS || itp == Theory::RAT_LESS || itp == Theory::REAL_LESS) {
      TermList* left = lit->nthArgument(0); TermList* right = lit->nthArgument(1);
      unsigned var;
      Term* t = 0;
      if(left->isVar() && !right->isVar()){
       t = right->term();
       var = left->var();
      }
      if(right->isVar() && !left->isVar()){
       t = left->term();
       var = right->var();
      }
      if(t){
        // do occurs check
        VariableIterator vit(t);
        while(vit.hasNext()) if(vit.next().var()==var) return;

        // we are okay
        Substitution s1;
        s1.bind(var,t);
        subs.push(s1);
        if(lit->polarity()){
         t = tryGetDifferentValue(t);
         if(t){
           Substitution s2;
           s2.bind(var,t);
           subs.push(s2);
         }
        }
      }
    }
    // TODO cover other cases ...
  }
}